

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeNonAtomicLoad(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> _Var1;
  int8_t iVar2;
  byte bVar3;
  Index IVar4;
  BasicType BVar5;
  uint32_t uVar6;
  uint uVar7;
  Expression *pEVar8;
  Load *pLVar9;
  bool bVar10;
  Type TVar11;
  ulong local_50;
  size_t local_48;
  char *pcStack_40;
  Type local_38;
  Type type_local;
  
  this_00 = &this->random;
  local_38.id = type.id;
  iVar2 = Random::get(this_00);
  IVar4 = logify(this,(int)iVar2);
  pEVar8 = makePointer(this);
  BVar5 = Type::getBasic(&local_38);
  switch(BVar5) {
  case none:
  case unreachable:
    ::wasm::handle_unreachable
              ("invalid type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0x696);
  case i32:
    bVar3 = Random::get(this_00);
    bVar10 = (bool)(bVar3 & 1);
    uVar6 = Random::upTo(this_00,3);
    if (uVar6 == 2) {
switchD_00156e7f_caseD_2:
      uVar7 = Random::pick<int,int,int>(this_00,1,2,4);
      TVar11.id = local_38.id;
      _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
      local_48 = *(size_t *)
                  _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                  .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      pcStack_40 = *(char **)((long)_Var1.
                                    super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                    .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
      pLVar9 = MixedArena::alloc<wasm::Load>(&((this->builder).wasm)->allocator);
      pLVar9->isAtomic = false;
      pLVar9->bytes = '\x04';
      goto LAB_0015703c;
    }
    if (uVar6 == 1) goto switchD_00156e7f_caseD_1;
    if (uVar6 != 0) {
      ::wasm::handle_unreachable
                ("unexpected value",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0x662);
    }
switchD_00156e7f_caseD_0:
    TVar11.id = local_38.id;
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    local_48 = *(size_t *)
                _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    pcStack_40 = *(char **)((long)_Var1.
                                  super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                  .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    pLVar9 = MixedArena::alloc<wasm::Load>(&((this->builder).wasm)->allocator);
    pLVar9->isAtomic = false;
    pLVar9->bytes = '\x01';
    pLVar9->signed_ = bVar10;
    (pLVar9->offset).addr = (ulong)IVar4;
    (pLVar9->align).addr = 1;
    goto LAB_0015704f;
  case i64:
    bVar3 = Random::get(this_00);
    uVar6 = Random::upTo(this_00,4);
    if (3 < uVar6) {
      ::wasm::handle_unreachable
                ("unexpected value",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0x67e);
    }
    bVar10 = (bool)(bVar3 & 1);
    switch(uVar6) {
    case 0:
      goto switchD_00156e7f_caseD_0;
    case 1:
switchD_00156e7f_caseD_1:
      uVar7 = Random::pick<int,int>(this_00,1,2);
      TVar11.id = local_38.id;
      _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
      local_48 = *(size_t *)
                  _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                  .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      pcStack_40 = *(char **)((long)_Var1.
                                    super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                    .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
      pLVar9 = MixedArena::alloc<wasm::Load>(&((this->builder).wasm)->allocator);
      pLVar9->isAtomic = false;
      pLVar9->bytes = '\x02';
      break;
    case 2:
      goto switchD_00156e7f_caseD_2;
    case 3:
      uVar7 = Random::pick<int,int,int,int>(this_00,1,2,4,8);
      TVar11.id = local_38.id;
      _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
      local_48 = *(size_t *)
                  _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                  .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      pcStack_40 = *(char **)((long)_Var1.
                                    super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                    .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
      pLVar9 = MixedArena::alloc<wasm::Load>(&((this->builder).wasm)->allocator);
      pLVar9->isAtomic = false;
      pLVar9->bytes = '\b';
    }
LAB_0015703c:
    local_50 = (ulong)IVar4;
    pLVar9->signed_ = bVar10;
    (pLVar9->offset).addr = local_50;
    goto LAB_00157048;
  case f32:
    uVar7 = Random::pick<int,int,int>(this_00,1,2,4);
    TVar11.id = local_38.id;
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    local_48 = *(size_t *)
                _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    pcStack_40 = *(char **)((long)_Var1.
                                  super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                  .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    pLVar9 = MixedArena::alloc<wasm::Load>(&((this->builder).wasm)->allocator);
    pLVar9->isAtomic = false;
    pLVar9->bytes = '\x04';
    pLVar9->signed_ = false;
    break;
  case f64:
    uVar7 = Random::pick<int,int,int,int>(this_00,1,2,4,8);
    TVar11.id = local_38.id;
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    local_48 = *(size_t *)
                _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    pcStack_40 = *(char **)((long)_Var1.
                                  super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                  .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    pLVar9 = MixedArena::alloc<wasm::Load>(&((this->builder).wasm)->allocator);
    pLVar9->isAtomic = false;
    pLVar9->bytes = '\b';
    pLVar9->signed_ = false;
    break;
  case v128:
    if (((this->wasm->features).features & 8) == 0) {
      pLVar9 = (Load *)makeTrivial(this,local_38);
      return (Expression *)pLVar9;
    }
    uVar7 = Random::pick<int,int,int,int,int>(this_00,1,2,4,8,0x10);
    TVar11.id = local_38.id;
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    local_48 = *(size_t *)
                _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    pcStack_40 = *(char **)((long)_Var1.
                                  super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                  .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    pLVar9 = MixedArena::alloc<wasm::Load>(&((this->builder).wasm)->allocator);
    pLVar9->isAtomic = false;
    pLVar9->bytes = '\x10';
    pLVar9->signed_ = false;
    break;
  default:
    ::wasm::handle_unreachable
              ("invalid type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0x698);
  }
  (pLVar9->offset).addr = (ulong)IVar4;
LAB_00157048:
  (pLVar9->align).addr = (ulong)uVar7;
LAB_0015704f:
  pLVar9->ptr = pEVar8;
  (pLVar9->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = TVar11.id;
  (pLVar9->memory).super_IString.str._M_len = local_48;
  (pLVar9->memory).super_IString.str._M_str = pcStack_40;
  return (Expression *)pLVar9;
}

Assistant:

Expression* TranslateToFuzzReader::makeNonAtomicLoad(Type type) {
  auto offset = logify(get());
  auto ptr = makePointer();
  switch (type.getBasic()) {
    case Type::i32: {
      bool signed_ = get() & 1;
      switch (upTo(3)) {
        case 0:
          return builder.makeLoad(
            1, signed_, offset, 1, ptr, type, wasm.memories[0]->name);
        case 1:
          return builder.makeLoad(
            2, signed_, offset, pick(1, 2), ptr, type, wasm.memories[0]->name);
        case 2:
          return builder.makeLoad(4,
                                  signed_,
                                  offset,
                                  pick(1, 2, 4),
                                  ptr,
                                  type,
                                  wasm.memories[0]->name);
      }
      WASM_UNREACHABLE("unexpected value");
    }
    case Type::i64: {
      bool signed_ = get() & 1;
      switch (upTo(4)) {
        case 0:
          return builder.makeLoad(
            1, signed_, offset, 1, ptr, type, wasm.memories[0]->name);
        case 1:
          return builder.makeLoad(
            2, signed_, offset, pick(1, 2), ptr, type, wasm.memories[0]->name);
        case 2:
          return builder.makeLoad(4,
                                  signed_,
                                  offset,
                                  pick(1, 2, 4),
                                  ptr,
                                  type,
                                  wasm.memories[0]->name);
        case 3:
          return builder.makeLoad(8,
                                  signed_,
                                  offset,
                                  pick(1, 2, 4, 8),
                                  ptr,
                                  type,
                                  wasm.memories[0]->name);
      }
      WASM_UNREACHABLE("unexpected value");
    }
    case Type::f32: {
      return builder.makeLoad(
        4, false, offset, pick(1, 2, 4), ptr, type, wasm.memories[0]->name);
    }
    case Type::f64: {
      return builder.makeLoad(
        8, false, offset, pick(1, 2, 4, 8), ptr, type, wasm.memories[0]->name);
    }
    case Type::v128: {
      if (!wasm.features.hasSIMD()) {
        return makeTrivial(type);
      }
      return builder.makeLoad(16,
                              false,
                              offset,
                              pick(1, 2, 4, 8, 16),
                              ptr,
                              type,
                              wasm.memories[0]->name);
    }
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("invalid type");
  }
  WASM_UNREACHABLE("invalid type");
}